

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::ImageDataParameter::MergePartialFromCodedStream
          (ImageDataParameter *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  void *pvVar3;
  float *pfVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  byte *pbVar8;
  long lVar9;
  char *field_name;
  UnknownFieldSet *unknown_fields;
  int iVar10;
  pointer data;
  char cVar11;
  uint tag;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  pair<unsigned_long,_bool> pVar14;
  pair<unsigned_long,_bool> pVar15;
  float local_4c;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_38 = &this->root_folder_;
  local_40 = &this->mean_file_;
  local_48 = &this->source_;
  do {
    pbVar8 = input->buffer_;
    uVar7 = 0;
    if (pbVar8 < input->buffer_end_) {
      bVar1 = *pbVar8;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003afe26;
      input->buffer_ = pbVar8 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003afe26:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_003afea8_default;
    cVar11 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->source_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_48,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,local_48->ptr_);
      iVar10 = 6;
      if (bVar6) {
        data = (local_48->ptr_->_M_dataplus)._M_p;
        iVar10 = (int)local_48->ptr_->_M_string_length;
        field_name = "caffe.ImageDataParameter.source";
LAB_003b002b:
        google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,iVar10,PARSE,field_name);
        goto LAB_003afe84;
      }
      goto LAB_003afe86;
    case 2:
      if (cVar11 != '\x15') break;
      pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar8 = *pbVar8 | 4;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_4c);
        if (!bVar6) {
          iVar10 = 6;
          goto LAB_003afe86;
        }
      }
      else {
        local_4c = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->scale_ = local_4c;
      goto LAB_003afe84;
    case 3:
      if (cVar11 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if ((this->mean_file_).ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_40,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,local_40->ptr_);
        iVar10 = 6;
        if (bVar6) {
          data = (local_40->ptr_->_M_dataplus)._M_p;
          iVar10 = (int)local_40->ptr_->_M_string_length;
          field_name = "caffe.ImageDataParameter.mean_file";
          goto LAB_003b002b;
        }
        goto LAB_003afe86;
      }
      break;
    case 4:
      if (cVar11 == ' ') {
        pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar8 = *pbVar8 | 8;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->batch_size_ = (uint)bVar1;
LAB_003b01a0:
            input->buffer_ = pbVar8 + 1;
            goto LAB_003afe84;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->batch_size_ = (uint32)lVar9;
LAB_003b0289:
        iVar10 = 6;
        if (-1 < lVar9) goto LAB_003afe84;
        goto LAB_003afe86;
      }
      break;
    case 5:
      if (cVar11 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->crop_size_ = (uint)bVar1;
            goto LAB_003b01a0;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->crop_size_ = (uint32)lVar9;
        goto LAB_003b0289;
      }
      break;
    case 6:
      if (cVar11 == '0') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar14._8_8_ = 1;
          pVar14.first = (long)(char)uVar2;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->mirror_ = pVar14.first != 0;
          goto LAB_003afe84;
        }
        goto LAB_003afe86;
      }
      break;
    case 7:
      if (cVar11 == '8') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->rand_skip_ = (uint)bVar1;
            goto LAB_003b01a0;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->rand_skip_ = (uint32)lVar9;
        goto LAB_003b0289;
      }
      break;
    case 8:
      if (cVar11 == '@') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar13._8_8_ = 1;
          pVar13.first = (long)(char)uVar2;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->shuffle_ = pVar13.first != 0;
          goto LAB_003afe84;
        }
        goto LAB_003afe86;
      }
      break;
    case 9:
      if (cVar11 == 'H') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->new_height_ = (uint)bVar1;
            goto LAB_003b01a0;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->new_height_ = (uint32)lVar9;
        goto LAB_003b0289;
      }
      break;
    case 10:
      if (cVar11 == 'P') {
        pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar8 = *pbVar8 | 1;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->new_width_ = (uint)bVar1;
            goto LAB_003b01a0;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->new_width_ = (uint32)lVar9;
        goto LAB_003b0289;
      }
      break;
    case 0xb:
      if (cVar11 == 'X') {
        pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar8 = *pbVar8 | 2;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar15._8_8_ = 1;
          pVar15.first = (long)(char)uVar2;
        }
        else {
          pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->is_color_ = pVar15.first != 0;
          goto LAB_003afe84;
        }
        goto LAB_003afe86;
      }
      break;
    case 0xc:
      if (cVar11 == 'b') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        if ((this->root_folder_).ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_38,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,local_38->ptr_);
        iVar10 = 6;
        if (bVar6) {
          data = (local_38->ptr_->_M_dataplus)._M_p;
          iVar10 = (int)local_38->ptr_->_M_string_length;
          field_name = "caffe.ImageDataParameter.root_folder";
          goto LAB_003b002b;
        }
        goto LAB_003afe86;
      }
    }
switchD_003afea8_default:
    iVar10 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar6 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
      iVar10 = 6;
      if (bVar6) {
LAB_003afe84:
        iVar10 = 0;
      }
    }
LAB_003afe86:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool ImageDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ImageDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string mean_file = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_mean_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->mean_file().data(), this->mean_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.mean_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 crop_size = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_crop_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &crop_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool mirror = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_mirror();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &mirror_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 rand_skip = 7 [default = 0];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_rand_skip();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &rand_skip_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool shuffle = 8 [default = false];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          set_has_shuffle();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &shuffle_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 new_height = 9 [default = 0];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_new_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &new_height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 new_width = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_new_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &new_width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool is_color = 11 [default = true];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          set_has_is_color();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &is_color_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string root_folder = 12 [default = ""];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_root_folder()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->root_folder().data(), this->root_folder().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.root_folder");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ImageDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ImageDataParameter)
  return false;
#undef DO_
}